

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

BOOL CorUnix::GetThreadTimesInternal(HANDLE hThread,LPFILETIME lpKernelTime,LPFILETIME lpUserTime)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  pthread_t __thread_id;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 local_60 [8];
  timespec ts;
  IPalObject *pIStack_48;
  clockid_t cid;
  IPalObject *pobjThread;
  CPalThread *pTargetThread;
  CPalThread *pThread;
  PAL_ERROR palError;
  BOOL retval;
  long calcTime;
  LPFILETIME lpUserTime_local;
  LPFILETIME lpKernelTime_local;
  HANDLE hThread_local;
  
  pThread._4_4_ = 0;
  pIStack_48 = (IPalObject *)0x0;
  calcTime = (long)lpUserTime;
  lpUserTime_local = lpKernelTime;
  lpKernelTime_local = (LPFILETIME)hThread;
  pTargetThread = InternalGetCurrentThread();
  pThread._0_4_ =
       InternalGetThreadDataFromHandle
                 (pTargetThread,lpKernelTime_local,0,(CPalThread **)&pobjThread,
                  &stack0xffffffffffffffb8);
  if ((PAL_ERROR)pThread == 0) {
    CPalThread::Lock((CPalThread *)pobjThread,pTargetThread);
    __thread_id = CPalThread::GetPThreadSelf((CPalThread *)pobjThread);
    iVar2 = pthread_getcpuclockid(__thread_id,(__clockid_t *)((long)&ts.tv_nsec + 4));
    if (iVar2 == 0) {
      iVar2 = clock_gettime(ts.tv_nsec._4_4_,(timespec *)local_60);
      if (iVar2 == 0) {
        CPalThread::Unlock((CPalThread *)pobjThread,pTargetThread);
        *(__time_t *)calcTime = ts.tv_sec + (long)local_60 * 1000000000;
        lpUserTime_local->dwLowDateTime = 0;
        lpUserTime_local->dwHighDateTime = 0;
        return 1;
      }
      fprintf(_stderr,"] %s %s:%d","GetThreadTimesInternal",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x577);
      __stream = _stderr;
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(__stream,"clock_gettime() failed; errno is %d (%s)\n",(ulong)uVar1,pcVar5);
      SetLastError(0x54f);
      CPalThread::Unlock((CPalThread *)pobjThread,pTargetThread);
    }
    else {
      fprintf(_stderr,"] %s %s:%d","GetThreadTimesInternal",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x56e);
      fprintf(_stderr,"Unable to get clock from thread\n",lpKernelTime_local);
      SetLastError(0x54f);
      CPalThread::Unlock((CPalThread *)pobjThread,pTargetThread);
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","GetThreadTimesInternal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x564);
    fprintf(_stderr,"Unable to get thread data from handle %pthread\n",lpKernelTime_local);
    SetLastError(0x54f);
  }
  *(undefined4 *)calcTime = 0;
  *(undefined4 *)(calcTime + 4) = 0;
  lpUserTime_local->dwLowDateTime = 0;
  lpUserTime_local->dwHighDateTime = 0;
  return pThread._4_4_;
}

Assistant:

BOOL
CorUnix::GetThreadTimesInternal(
    IN HANDLE hThread,
    OUT LPFILETIME lpKernelTime,
    OUT LPFILETIME lpUserTime)
{
    __int64 calcTime;
    BOOL retval = FALSE;

#if HAVE_MACH_THREADS
    thread_basic_info resUsage;
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthrCurrent = NULL;
    CPalThread *pthrTarget = NULL;
    IPalObject *pobjThread = NULL;
    mach_msg_type_number_t resUsage_count = THREAD_BASIC_INFO_COUNT;

    pthrCurrent = InternalGetCurrentThread();
    palError = InternalGetThreadDataFromHandle(
        pthrCurrent,
        hThread,
        0,
        &pthrTarget,
        &pobjThread
        );

    if (palError != NO_ERROR)
    {
        ASSERT("Unable to get thread data from handle %p"
              "thread\n", hThread);
        SetLastError(ERROR_INTERNAL_ERROR);
        goto SetTimesToZero;
    }

    pthrTarget->Lock(pthrCurrent);

    mach_port_t mhThread;
    mhThread = pthread_mach_thread_np(pthrTarget->GetPThreadSelf());

    kern_return_t status;
    status = thread_info(
        mhThread,
        THREAD_BASIC_INFO,
        (thread_info_t)&resUsage,
        &resUsage_count);

    pthrTarget->Unlock(pthrCurrent);

    if (status != KERN_SUCCESS)
    {
        ASSERT("Unable to get resource usage information for the current "
              "thread\n");
        SetLastError(ERROR_INTERNAL_ERROR);
        goto SetTimesToZero;
    }

    /* Get the time of user mode execution, in nanoseconds */
    calcTime = (__int64)resUsage.user_time.seconds * SECS_TO_NS;
    calcTime += (__int64)resUsage.user_time.microseconds * USECS_TO_NS;
    /* Assign the time into lpUserTime */
    lpUserTime->dwLowDateTime = (DWORD)calcTime;
    lpUserTime->dwHighDateTime = (DWORD)(calcTime >> 32);

    /* Get the time of kernel mode execution, in nanoseconds */
    calcTime = (__int64)resUsage.system_time.seconds * SECS_TO_NS;
    calcTime += (__int64)resUsage.system_time.microseconds * USECS_TO_NS;
    /* Assign the time into lpKernelTime */
    lpKernelTime->dwLowDateTime = (DWORD)calcTime;
    lpKernelTime->dwHighDateTime = (DWORD)(calcTime >> 32);

    retval = TRUE;

    goto GetThreadTimesInternalExit;

#elif defined(__NetBSD__) && !HAVE_PTHREAD_GETCPUCLOCKID /* Currently unimplemented */

    PAL_ERROR palError;
    CPalThread *pThread;
    CPalThread *pTargetThread;
    IPalObject *pobjThread = NULL;
    kvm_t *kd;
    int cnt, nlwps;
    struct kinfo_lwp *klwp;
    int i;
    bool found = false;

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0,
        &pTargetThread,
        &pobjThread
        );
    if (palError != NO_ERROR)
    {
        ASSERT("Unable to get thread data from handle %p"
              "thread\n", hThread);
        SetLastError(ERROR_INTERNAL_ERROR);
        goto SetTimesToZero;
    }

    kd = kvm_open(NULL, NULL, NULL, KVM_NO_FILES, "kvm_open");
    if (kd == NULL)
    {
        ASSERT("kvm_open(3) error");
        SetLastError(ERROR_INTERNAL_ERROR);
        goto SetTimesToZero;
    }

    pTargetThread->Lock(pThread);

    klwp = kvm_getlwps(kd, getpid(), 0, sizeof(struct kinfo_lwp), &nlwps);
    if (klwp == NULL || nlwps < 1)
    {
        kvm_close(kd);
        ASSERT("Unable to get clock from %p thread\n", hThread);
        SetLastError(ERROR_INTERNAL_ERROR);
        pTargetThread->Unlock(pThread);
        goto SetTimesToZero;
    }

    for (i = 0; i < nlwps; i++)
    {
        if (klwp[i].l_lid == THREADSilentGetCurrentThreadId())
        {
            found = true;
            break;
        }
    }

    if (!found)
    {
        kvm_close(kd);
        ASSERT("Unable to get clock from %p thread\n", hThread);
        SetLastError(ERROR_INTERNAL_ERROR);
        pTargetThread->Unlock(pThread);
        goto SetTimesToZero;
    }

    pTargetThread->Unlock(pThread);

    kvm_close(kd);

    calcTime = (__int64) klwp[i].l_rtime_sec * SECS_TO_NS;
    calcTime += (__int64) klwp[i].l_rtime_usec * USECS_TO_NS;
    lpUserTime->dwLowDateTime = (DWORD)calcTime;
    lpUserTime->dwHighDateTime = (DWORD)(calcTime >> 32);

    /* NetBSD as of (7.0) doesn't differentiate used time in user/kernel for lwp */
    lpKernelTime->dwLowDateTime = 0;
    lpKernelTime->dwHighDateTime = 0;

    retval = TRUE;
    goto GetThreadTimesInternalExit;

#else //HAVE_MACH_THREADS

    PAL_ERROR palError;
    CPalThread *pThread;
    CPalThread *pTargetThread;
    IPalObject *pobjThread = NULL;
#ifdef __sun
    int fd;
#else // __sun
    clockid_t cid;
#endif // __sun

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0,
        &pTargetThread,
        &pobjThread
        );
    if (palError != NO_ERROR)
    {
        ASSERT("Unable to get thread data from handle %p"
              "thread\n", hThread);
        SetLastError(ERROR_INTERNAL_ERROR);
        goto SetTimesToZero;
    }

    pTargetThread->Lock(pThread);

#if HAVE_PTHREAD_GETCPUCLOCKID
    if (pthread_getcpuclockid(pTargetThread->GetPThreadSelf(), &cid) != 0)
    {
        ASSERT("Unable to get clock from thread\n", hThread);
        SetLastError(ERROR_INTERNAL_ERROR);
        pTargetThread->Unlock(pThread);
        goto SetTimesToZero;
    }

    struct timespec ts;
    if (clock_gettime(cid, &ts) != 0)
    {
        ASSERT("clock_gettime() failed; errno is %d (%s)\n", errno, strerror(errno));
        SetLastError(ERROR_INTERNAL_ERROR);
        pTargetThread->Unlock(pThread);
        goto SetTimesToZero;
    }
#elif defined(__sun)
    timestruc_t ts;
    int readResult;
    char statusFilename[64];
    snprintf(statusFilename, sizeof(statusFilename), "/proc/%d/lwp/%d/lwpstatus", getpid(), pTargetThread->GetLwpId());
    fd = open(statusFilename, O_RDONLY);
    if (fd == -1)
    {
       ASSERT("open(%s) failed; errno is %d (%s)\n", statusFilename, errno, strerror(errno));
       SetLastError(ERROR_INTERNAL_ERROR);
       pTargetThread->Unlock(pThread);
       goto SetTimesToZero;
    }

    lwpstatus_t status;
    do
    {
        readResult = read(fd, &status, sizeof(status));
    }
    while ((readResult == -1) && (errno == EINTR));

    close(fd);

    ts = status.pr_utime;
#else // HAVE_PTHREAD_GETCPUCLOCKID
#error "Don't know how to obtain user cpu time on this platform."
#endif // HAVE_PTHREAD_GETCPUCLOCKID

    pTargetThread->Unlock(pThread);

    /* Calculate time in nanoseconds and assign to user time */
    calcTime = (__int64) ts.tv_sec * SECS_TO_NS;
    calcTime += (__int64) ts.tv_nsec;
    lpUserTime->dwLowDateTime = (DWORD)calcTime;
    lpUserTime->dwHighDateTime = (DWORD)(calcTime >> 32);

    /* Set kernel time to zero, for now */
    lpKernelTime->dwLowDateTime = 0;
    lpKernelTime->dwHighDateTime = 0;

    retval = TRUE;
    goto GetThreadTimesInternalExit;

#endif //HAVE_MACH_THREADS

SetTimesToZero:

    lpUserTime->dwLowDateTime = 0;
    lpUserTime->dwHighDateTime = 0;
    lpKernelTime->dwLowDateTime = 0;
    lpKernelTime->dwHighDateTime = 0;
    goto GetThreadTimesInternalExit;

GetThreadTimesInternalExit:
    return retval;
}